

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O3

ErrorCode __thiscall ComponentManager::LoadLibrary(ComponentManager *this,char *name)

{
  Node *pNVar1;
  Node *pNVar2;
  ErrorCode EVar3;
  void *pvVar4;
  code *pcVar5;
  code *pcVar6;
  undefined8 uVar7;
  IModule *pIVar8;
  ModuleInfo *pMVar9;
  Node *pNVar10;
  allocator<char> local_49;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pvVar4 = (void *)dlopen(name,1);
  if (pvVar4 == (void *)0x0) {
    uVar7 = dlerror();
    jh_log_print(2,"virtual ErrorCode ComponentManager::LoadLibrary(const char *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                 ,0x54,"Failed to open shared lib \"%s\": %s",name,uVar7);
  }
  else {
    pcVar5 = (code *)dlsym(pvVar4,"JHCOM_LibraryEntry");
    pcVar6 = (code *)dlsym(pvVar4,"JHCOM_GetModule");
    if (pcVar5 != (code *)0x0 && pcVar6 != (code *)0x0) {
      EVar3 = (*pcVar5)(this);
      if (EVar3 != kNoError) {
        return EVar3;
      }
      pIVar8 = (IModule *)(*pcVar6)();
      (*(code *)**(undefined8 **)pIVar8)(pIVar8);
      (**(code **)(*(long *)pIVar8 + 0x30))(pIVar8);
      pMVar9 = (ModuleInfo *)
               operator_new(0x30,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                            ,0x6b);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
      (pMVar9->mName)._M_dataplus._M_p = (pointer)&(pMVar9->mName).field_2;
      std::__cxx11::string::_M_construct<char*>((string *)pMVar9,local_48,local_40 + (long)local_48)
      ;
      pMVar9->mModule = pIVar8;
      pMVar9->mHandle = pvVar4;
      if (local_48 != local_38) {
        operator_delete(local_48,local_38[0] + 1);
      }
      pNVar10 = (Node *)operator_new(0x18,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                     ,0xa7);
      pNVar10->val = pMVar9;
      pNVar1 = (this->mModules).mTail;
      pNVar2 = pNVar1->prev;
      pNVar10->prev = pNVar2;
      pNVar10->next = pNVar1;
      pNVar2->next = pNVar10;
      pNVar1->prev = pNVar10;
      return kNoError;
    }
    jh_log_print(2,"virtual ErrorCode ComponentManager::LoadLibrary(const char *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                 ,0x5e,"Failed to get symbol");
  }
  return kLoadFailed;
}

Assistant:

ErrorCode ComponentManager::LoadLibrary( const char *name )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	IModule *mod = NULL;
	ErrorCode result = kNoError;
	
	LOG_NOTICE( "Opening Library: %s", name );
	
	ErrorCode (*LoadLibrary)( IComponentManager *mgr );
	IModule *(*GetModule)();
	void *handle = dlopen( name, RTLD_LAZY );
	
	if ( handle == NULL )
	{
		result = kLoadFailed;
		LOG_WARN( "Failed to open shared lib \"%s\": %s", name, dlerror() );
	}
	else
	{
		LoadLibrary = (ErrorCode (*)(IComponentManager *mgr))dlsym( handle, "JHCOM_LibraryEntry" );
		GetModule = (IModule *(*)())dlsym( handle, "JHCOM_GetModule" );

		if ( GetModule == NULL || LoadLibrary == NULL )
		{
			result = kLoadFailed;
			LOG_WARN( "Failed to get symbol" );
		}
		else
		{
			LOG( "LoadLibrary is %p", LoadLibrary );
			LOG( "RegisterServices is %p", GetModule );
			result = LoadLibrary( this );
			
			if ( result == kNoError )
			{
				mod = GetModule();
				mod->AddRef();
				mod->loadComponents();
				ModuleInfo *info = jh_new ModuleInfo( name, mod, handle );
				mModules.push_back( info );
			}
		}
	}
	
	return result;
}